

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

HttpClient * __thiscall
kj::anon_unknown_36::NetworkHttpClient::getClient(NetworkHttpClient *this,Url *parsed)

{
  Network *pNVar1;
  iterator this_00;
  Url *this_01;
  bool bVar2;
  OwnPromiseNode *pOVar3;
  String *pSVar4;
  Promise<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,_std::nullptr_t>_> *params;
  Host *__y;
  pointer ppVar5;
  RefOrVoid<kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient> pPVar6;
  undefined8 uVar7;
  __enable_if_t<is_constructible<value_type,_pair<StringPtr,_Host>_>::value,_pair<iterator,_bool>_>
  _Var8;
  _Base_ptr local_1b8;
  byte local_191;
  undefined1 local_188 [16];
  Fault f_1;
  DebugExpression<bool_&> _kjCondition_1;
  pair<kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host> local_160;
  _Base_ptr local_128;
  __enable_if_t<is_constructible<value_type,_pair<StringPtr,_Host>_>::value,_pair<iterator,_bool>_>
  insertResult;
  StringPtr nameRef;
  Host host;
  StringPtr local_d8;
  Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> local_c8;
  Promise<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,_std::nullptr_t>_> local_c0;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6418:17),_kj::Own<kj::NetworkAddress>_>
  promise;
  Fault local_b0;
  Network *local_a8;
  Network *_kj_result;
  Network *networkToUse;
  StringPtr local_90;
  _Self local_80;
  iterator iter;
  map<kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>_>
  *hosts;
  Fault local_60;
  Fault f;
  bool local_49;
  undefined1 local_48 [7];
  bool _kjCondition;
  bool local_31;
  undefined1 local_30 [7];
  bool isHttp;
  byte local_19;
  Url *pUStack_18;
  bool isHttps;
  Url *parsed_local;
  NetworkHttpClient *this_local;
  
  pUStack_18 = parsed;
  parsed_local = (Url *)this;
  StringPtr::StringPtr((StringPtr *)local_30,"https");
  local_19 = String::operator==(&parsed->scheme,(StringPtr *)local_30);
  this_01 = pUStack_18;
  StringPtr::StringPtr((StringPtr *)local_48,"http");
  local_31 = String::operator==(&this_01->scheme,(StringPtr *)local_48);
  f.exception = (Exception *)
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_31);
  bVar2 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&f);
  local_191 = 1;
  if (!bVar2) {
    local_191 = local_19;
  }
  local_49 = (bool)(local_191 & 1);
  if (local_49 == false) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&>
              (&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x18fc,FAILED,"isHttp || isHttps","_kjCondition,",&local_49);
    kj::_::Debug::Fault::fatal(&local_60);
  }
  if ((local_19 & 1) == 0) {
    local_1b8 = (_Base_ptr)&this->httpHosts;
  }
  else {
    local_1b8 = (_Base_ptr)&this->httpsHosts;
  }
  iter._M_node = local_1b8;
  StringPtr::StringPtr(&local_90,&pUStack_18->host);
  local_80._M_node =
       (_Base_ptr)
       std::
       map<kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>_>
       ::find(local_1b8,&local_90);
  networkToUse = (Network *)
                 std::
                 map<kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>_>
                 ::end((map<kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>_>
                        *)iter._M_node);
  bVar2 = std::operator==(&local_80,(_Self *)&networkToUse);
  if (bVar2) {
    _kj_result = this->network;
    if ((local_19 & 1) != 0) {
      local_a8 = kj::_::readMaybe<kj::Network>(&this->tlsNetwork);
      if (local_a8 == (Network *)0x0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[38]>
                  (&local_b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0x190e,FAILED,"tlsNetwork != nullptr",
                   "\"this HttpClient doesn\'t support HTTPS\"",
                   (char (*) [38])"this HttpClient doesn\'t support HTTPS");
        kj::_::Debug::Fault::fatal(&local_b0);
      }
      pOVar3 = (OwnPromiseNode *)mv<kj::Network*>(&local_a8);
      promise.super_PromiseBase.node.ptr = (PromiseBase)pOVar3->ptr;
      _kj_result = (Network *)promise.super_PromiseBase.node.ptr;
    }
    pNVar1 = _kj_result;
    StringPtr::StringPtr(&local_d8,&pUStack_18->host);
    uVar7 = 0x50;
    if ((local_19 & 1) != 0) {
      uVar7 = 0x1bb;
    }
    (**pNVar1->_vptr_Network)(&local_c8,pNVar1,local_d8.content.ptr,local_d8.content.size_,uVar7);
    host.client.ptr = (PromiseNetworkAddressHttpClient *)this;
    Promise<kj::Own<kj::NetworkAddress,decltype(nullptr)>>::
    then<kj::(anonymous_namespace)::NetworkHttpClient::getClient(kj::Url&)::_lambda(kj::Own<kj::NetworkAddress,decltype(nullptr)>)_1_>
              ((Promise<kj::Own<kj::NetworkAddress,decltype(nullptr)>> *)&local_c0,(Type *)&local_c8
              );
    Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>::~Promise(&local_c8);
    pSVar4 = mv<kj::String>(&pUStack_18->host);
    String::String((String *)&nameRef.content.size_,pSVar4);
    params = mv<kj::Promise<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,decltype(nullptr)>>>
                       (&local_c0);
    heap<kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient,kj::Promise<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,decltype(nullptr)>>>
              ((kj *)&host.name.content.disposer,params);
    StringPtr::StringPtr((StringPtr *)&insertResult.second,(String *)&nameRef.content.size_);
    this_00 = iter;
    __y = mv<kj::(anonymous_namespace)::NetworkHttpClient::Host>((Host *)&nameRef.content.size_);
    std::make_pair<kj::StringPtr&,kj::(anonymous_namespace)::NetworkHttpClient::Host>
              (&local_160,(StringPtr *)&insertResult.second,__y);
    _Var8 = std::
            map<kj::StringPtr,kj::(anonymous_namespace)::NetworkHttpClient::Host,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::(anonymous_namespace)::NetworkHttpClient::Host>>>
            ::insert<std::pair<kj::StringPtr,kj::(anonymous_namespace)::NetworkHttpClient::Host>>
                      ((map<kj::StringPtr,kj::(anonymous_namespace)::NetworkHttpClient::Host,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::(anonymous_namespace)::NetworkHttpClient::Host>>>
                        *)this_00._M_node,&local_160);
    local_128 = (_Base_ptr)_Var8.first._M_node;
    insertResult.first._M_node._0_1_ = _Var8.second;
    std::pair<kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>::~pair(&local_160);
    f_1.exception =
         (Exception *)
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)&insertResult);
    bVar2 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&f_1);
    if (!bVar2) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool&>&>
                ((Fault *)(local_188 + 8),
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x191e,FAILED,"insertResult.second","_kjCondition,",
                 (DebugExpression<bool_&> *)&f_1);
      kj::_::Debug::Fault::fatal((Fault *)(local_188 + 8));
    }
    local_80._M_node = local_128;
    handleCleanup((NetworkHttpClient *)local_188,
                  (map<kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>_>
                   *)this,iter);
    TaskSet::add(&this->tasks,(Promise<void> *)local_188);
    Promise<void>::~Promise((Promise<void> *)local_188);
    Host::~Host((Host *)&nameRef.content.size_);
    Promise<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,_std::nullptr_t>_>::~Promise
              (&local_c0);
  }
  ppVar5 = std::
           _Rb_tree_iterator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>
           ::operator->(&local_80);
  pPVar6 = Own<kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient,_std::nullptr_t>::
           operator*(&(ppVar5->second).client);
  return &pPVar6->super_HttpClient;
}

Assistant:

HttpClient& getClient(kj::Url& parsed) {
    bool isHttps = parsed.scheme == "https";
    bool isHttp = parsed.scheme == "http";
    KJ_REQUIRE(isHttp || isHttps);

    auto& hosts = isHttps ? httpsHosts : httpHosts;

    // Look for a cached client for this host.
    // TODO(perf): It would be nice to recognize when different hosts have the same address and
    //   reuse the same connection pool, but:
    //   - We'd need a reliable way to compare NetworkAddresses, e.g. .equals() and .hashCode().
    //     It's very Java... ick.
    //   - Correctly handling TLS would be tricky: we'd need to verify that the new hostname is
    //     on the certificate. When SNI is in use we might have to request an additional
    //     certificate (is that possible?).
    auto iter = hosts.find(parsed.host);

    if (iter == hosts.end()) {
      // Need to open a new connection.
      kj::Network* networkToUse = &network;
      if (isHttps) {
        networkToUse = &KJ_REQUIRE_NONNULL(tlsNetwork, "this HttpClient doesn't support HTTPS");
      }

      auto promise = networkToUse->parseAddress(parsed.host, isHttps ? 443 : 80)
          .then([this](kj::Own<kj::NetworkAddress> addr) {
        return kj::heap<NetworkAddressHttpClient>(
            timer, responseHeaderTable, kj::mv(addr), settings);
      });

      Host host {
        kj::mv(parsed.host),
        kj::heap<PromiseNetworkAddressHttpClient>(kj::mv(promise))
      };
      kj::StringPtr nameRef = host.name;

      auto insertResult = hosts.insert(std::make_pair(nameRef, kj::mv(host)));
      KJ_ASSERT(insertResult.second);
      iter = insertResult.first;

      tasks.add(handleCleanup(hosts, iter));
    }

    return *iter->second.client;
  }